

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__fog_color
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  undefined8 uVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  char cVar5;
  xmlChar **ppxVar6;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  uVar1 = profile_GLES__technique__pass__fog_color__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar3 = profile_GLES__technique__pass__fog_color__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar3 + 8) = uVar1;
  uVar1 = profile_GLES__technique__pass__fog_color__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar3 + 0x10) =
       profile_GLES__technique__pass__fog_color__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar3 + 0x18) = uVar1;
  *attributeDataPtr = pbVar3;
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        cVar5 = '\x03';
        goto LAB_006b6556;
      }
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar6[1];
      ppxVar6 = ppxVar6 + 2;
      if (SVar4 == 0x76887d) {
        *(ParserChar **)(pbVar3 + 0x18) = additionalText;
LAB_006b6554:
        cVar5 = '\0';
      }
      else if (SVar4 == 0x7c83b5) {
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ,additionalText,(XSList<float> *)(pbVar3 + 8));
        if (bVar2) {
          *pbVar3 = *pbVar3 | 1;
          cVar5 = '\x04';
          bVar2 = true;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xd5a5032,0x7c83b5,additionalText);
          bVar2 = !bVar2;
          cVar5 = bVar2 * '\x03' + '\x01';
        }
        if (bVar2) goto LAB_006b6554;
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xd5a5032,text,additionalText);
        cVar5 = '\x01';
        if (!bVar2) goto LAB_006b6554;
      }
LAB_006b6556:
    } while (cVar5 == '\0');
    if (cVar5 != '\x03') {
      return false;
    }
  }
  if (((*pbVar3 & 1) == 0) &&
     (bVar2 = GeneratedSaxParser::
              ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
              ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                        (&this->
                          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                         ,"0.0E1 0.0E1 0.0E1 0.0E1",(XSList<float> *)(pbVar3 + 8)), bVar2)) {
    *pbVar3 = *pbVar3 | 1;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__fog_color( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__fog_color( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__fog_color__AttributeData* attributeData = newData<profile_GLES__technique__pass__fog_color__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_FOG_COLOR, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FOG_COLOR,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FOG_COLOR,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__fog_color__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FOG_COLOR,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FOG_COLOR, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__fog_color__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1 0.0E1 0.0E1", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__fog_color__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}


    return true;
}